

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void terminal_alloc(EditLine *el,termcapstr *t,char *cap)

{
  char **ppcVar1;
  char **ppcVar2;
  size_t sVar3;
  char *pcVar4;
  ulong local_860;
  char *local_858;
  char *ptr;
  char **str;
  char **tmp;
  char **tlist;
  size_t clen;
  size_t tlen;
  char termbuf [2048];
  char *cap_local;
  termcapstr *t_local;
  EditLine *el_local;
  
  ppcVar1 = (el->el_terminal).t_str;
  ppcVar2 = ppcVar1 + ((long)(t + -0x13355) >> 4);
  memset(&tlen,0,0x800);
  if ((cap == (char *)0x0) || (*cap == '\0')) {
    *ppcVar2 = (char *)0x0;
  }
  else {
    sVar3 = strlen(cap);
    if (*ppcVar2 == (char *)0x0) {
      local_860 = 0;
    }
    else {
      local_860 = strlen(*ppcVar2);
    }
    if (local_860 < sVar3) {
      if ((el->el_terminal).t_loc + 3 < 0x800) {
        pcVar4 = (el->el_terminal).t_buf + (el->el_terminal).t_loc;
        *ppcVar2 = pcVar4;
        strcpy(pcVar4,cap);
        (el->el_terminal).t_loc = sVar3 + 1 + (el->el_terminal).t_loc;
      }
      else {
        clen = 0;
        for (str = ppcVar1; str < ppcVar1 + 0x27; str = str + 1) {
          if (((*str != (char *)0x0) && (**str != '\0')) && (*str != *ppcVar2)) {
            local_858 = *str;
            while (*local_858 != '\0') {
              termbuf[clen - 8] = *local_858;
              local_858 = local_858 + 1;
              clen = clen + 1;
            }
            termbuf[clen - 8] = '\0';
            clen = clen + 1;
          }
        }
        memcpy((el->el_terminal).t_buf,&tlen,0x800);
        (el->el_terminal).t_loc = clen;
        if ((el->el_terminal).t_loc + 3 < 0x800) {
          pcVar4 = (el->el_terminal).t_buf + (el->el_terminal).t_loc;
          *ppcVar2 = pcVar4;
          strcpy(pcVar4,cap);
          (el->el_terminal).t_loc = sVar3 + 1 + (el->el_terminal).t_loc;
        }
        else {
          fprintf((FILE *)el->el_errfile,"Out of termcap string space.\n");
        }
      }
    }
    else if (*ppcVar2 != (char *)0x0) {
      strcpy(*ppcVar2,cap);
    }
  }
  return;
}

Assistant:

static void
terminal_alloc(EditLine *el, const struct termcapstr *t, const char *cap)
{
	char termbuf[TC_BUFSIZE];
	size_t tlen, clen;
	char **tlist = el->el_terminal.t_str;
	char **tmp, **str = &tlist[t - tstr];

	(void) memset(termbuf, 0, sizeof(termbuf));
	if (cap == NULL || *cap == '\0') {
		*str = NULL;
		return;
	} else
		clen = strlen(cap);

	tlen = *str == NULL ? 0 : strlen(*str);

	/*
         * New string is shorter; no need to allocate space
         */
	if (clen <= tlen) {
		if (*str)
			(void) strcpy(*str, cap);	/* XXX strcpy is safe */
		return;
	}
	/*
         * New string is longer; see if we have enough space to append
         */
	if (el->el_terminal.t_loc + 3 < TC_BUFSIZE) {
						/* XXX strcpy is safe */
		(void) strcpy(*str = &el->el_terminal.t_buf[
		    el->el_terminal.t_loc], cap);
		el->el_terminal.t_loc += clen + 1;	/* one for \0 */
		return;
	}
	/*
         * Compact our buffer; no need to check compaction, cause we know it
         * fits...
         */
	tlen = 0;
	for (tmp = tlist; tmp < &tlist[T_str]; tmp++)
		if (*tmp != NULL && **tmp != '\0' && *tmp != *str) {
			char *ptr;

			for (ptr = *tmp; *ptr != '\0'; termbuf[tlen++] = *ptr++)
				continue;
			termbuf[tlen++] = '\0';
		}
	memcpy(el->el_terminal.t_buf, termbuf, TC_BUFSIZE);
	el->el_terminal.t_loc = tlen;
	if (el->el_terminal.t_loc + 3 >= TC_BUFSIZE) {
		(void) fprintf(el->el_errfile,
		    "Out of termcap string space.\n");
		return;
	}
					/* XXX strcpy is safe */
	(void) strcpy(*str = &el->el_terminal.t_buf[el->el_terminal.t_loc],
	    cap);
	el->el_terminal.t_loc += (size_t)clen + 1;	/* one for \0 */
	return;
}